

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O3

void __thiscall Vector<long_double>::Vector(Vector<long_double> *this,int csize,longdouble *val)

{
  longdouble lVar1;
  longdouble *plVar2;
  longdouble *plVar3;
  
  this->num_elts = 0;
  this->ptr_to_data = (longdouble *)0x0;
  if (0 < csize) {
    this->num_elts = csize;
    plVar2 = (longdouble *)operator_new__((ulong)(uint)csize * 0x10);
    this->ptr_to_data = plVar2;
    plVar3 = plVar2 + (uint)csize;
    lVar1 = *val;
    do {
      plVar3[-1] = lVar1;
      plVar3 = plVar3 + -1;
    } while (plVar2 < plVar3);
  }
  return;
}

Assistant:

Vector< T >::Vector(int csize, const T& val) : num_elts(0), ptr_to_data((T*)0)
{
#ifdef DEBUG
	std::cerr << "Vector<>::Vector(int, const T& )|size constructor   |";
#endif

    if (csize > 0 ){
	num_elts = csize;
	ptr_to_data = new T[num_elts];

	if ( ptr_to_data == 0 ) error("Vector<>::Vector(), Memoire insuffisante");
    } 

  T* p = ptr_to_data + num_elts;
  while ( p > ptr_to_data ) 
    *--p = val;//pb si = n'est pas surcharge pour le type T

#ifdef DEBUG
    fprintf(stderr," adr =  %x \n", ptr_to_data);
#endif
}